

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conformance.cc
# Opt level: O3

void anon_unknown.dwarf_b5e5::require_conform(string *expected,char *fmt,...)

{
  char *pcVar1;
  string *rhs;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string sys_printf_result;
  string npf_result;
  va_list args_1;
  char buf [256];
  ExpressionDecomposer local_274;
  Result local_270;
  undefined1 *local_250;
  char *local_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  string *local_230;
  undefined1 **local_228;
  char *local_220;
  undefined1 *local_218 [2];
  undefined1 local_208 [8];
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  char local_138 [255];
  undefined1 local_39;
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  local_250 = &local_240;
  local_248 = (char *)0x0;
  local_240 = 0;
  local_220 = &stack0x00000008;
  local_228 = (undefined1 **)0x3000000010;
  local_230 = expected;
  local_218[0] = local_1e8;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  vsnprintf(local_138,0x100,fmt,&local_228);
  pcVar1 = local_248;
  local_39 = 0;
  strlen(local_138);
  std::__cxx11::string::_M_replace((ulong)&local_250,0,pcVar1,(ulong)local_138);
  local_220 = (char *)0x0;
  local_218[0] = (undefined1 *)((ulong)local_218[0] & 0xffffffffffffff00);
  local_200 = &stack0x00000008;
  local_208._0_4_ = 0x10;
  local_208._4_4_ = 0x30;
  local_270.m_decomp.field_0.data.ptr = (char *)0x100;
  local_270.m_decomp.field_0._8_8_ = (char *)0x0;
  local_270._0_8_ = local_138;
  local_228 = local_218;
  local_1f8 = local_1e8;
  npf_vpprintf(npf_bufputc,&local_270,fmt,(__va_list_tag *)local_208);
  pcVar1 = local_220;
  if ((ulong)local_270.m_decomp.field_0._8_8_ < local_270.m_decomp.field_0.data.ptr) {
    *(char *)(local_270._0_8_ + local_270.m_decomp.field_0._8_8_) = '\0';
  }
  local_39 = 0;
  strlen(local_138);
  std::__cxx11::string::_M_replace((ulong)&local_228,0,pcVar1,(ulong)local_138);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_274,DT_REQUIRE);
  rhs = local_230;
  local_208 = (undefined1  [8])&local_250;
  doctest::detail::Expression_lhs<std::__cxx11::string&>::operator==
            (&local_270,(Expression_lhs<std::__cxx11::string&> *)local_208,local_230);
  doctest::detail::decomp_assert
            (DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/charlesnicholson[P]nanoprintf/tests/conformance.cc"
             ,0x3b,"sys_printf_result == expected",&local_270);
  doctest::String::~String((String *)&local_270.m_decomp.field_0.data);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_274,DT_REQUIRE);
  local_200 = (undefined1 *)CONCAT44(local_200._4_4_,local_274.m_at);
  local_208 = (undefined1  [8])&local_228;
  doctest::detail::Expression_lhs<std::__cxx11::string&>::operator==
            (&local_270,(Expression_lhs<std::__cxx11::string&> *)local_208,rhs);
  doctest::detail::decomp_assert
            (DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/charlesnicholson[P]nanoprintf/tests/conformance.cc"
             ,0x3c,"npf_result == expected",&local_270);
  doctest::String::~String((String *)&local_270.m_decomp.field_0.data);
  if (local_228 != local_218) {
    operator_delete(local_228,(ulong)(local_218[0] + 1));
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
  }
  return;
}

Assistant:

void require_conform(const std::string& expected, char const *fmt, ...) {
  char buf[256];

  std::string sys_printf_result; {
    va_list args;
    va_start(args, fmt);
    vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);
    buf[sizeof(buf)-1] = '\0';
    sys_printf_result = buf;
  }

  std::string npf_result; {
    va_list args;
    va_start(args, fmt);
    npf_vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);
    buf[sizeof(buf)-1] = '\0';
    npf_result = buf;
  }

  REQUIRE(sys_printf_result == expected);
  REQUIRE(npf_result == expected);
}